

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

int32_t __thiscall fasttext::Dictionary::find(Dictionary *this,string *w,uint32_t h)

{
  size_type sVar1;
  const_reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  uint in_EDX;
  long in_RDI;
  int32_t id;
  int32_t word2intsize;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar3;
  undefined4 local_1c;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10));
  local_1c = in_EDX % (uint)sVar1;
  while( true ) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)(int)local_1c);
    uVar3 = false;
    if (*pvVar2 != -1) {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x28);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)(int)local_1c);
      std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)__rhs,(long)*pvVar2);
      uVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar3,in_stack_ffffffffffffffd0),__rhs);
    }
    if ((bool)uVar3 == false) break;
    local_1c = (int)(local_1c + 1) % (int)(uint)sVar1;
  }
  return local_1c;
}

Assistant:

int32_t Dictionary::find(const std::string& w, uint32_t h) const {
	int32_t word2intsize = word2int_.size();
	int32_t id = h % word2intsize;
	while (word2int_[id] != -1 && words_[word2int_[id]].word != w) {
		id = (id + 1) % word2intsize;
	}
	return id;
}